

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t archive_read_format_cab_bid(archive_read *a,wchar_t best_bid)

{
  long *plVar1;
  int in_ESI;
  wchar_t next;
  char *h;
  ssize_t window;
  ssize_t offset;
  ssize_t bytes_avail;
  char *p;
  undefined4 in_stack_ffffffffffffffb8;
  wchar_t in_stack_ffffffffffffffbc;
  archive_read *in_stack_ffffffffffffffc0;
  ulong local_38;
  long local_30;
  long local_28;
  char *local_20;
  wchar_t local_4;
  
  if (in_ESI < 0x41) {
    plVar1 = (long *)__archive_read_ahead
                               (in_stack_ffffffffffffffc0,
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                (ssize_t *)0x250694);
    if (plVar1 == (long *)0x0) {
      local_4 = L'\xffffffff';
    }
    else if (*plVar1 == 0x4643534d) {
      local_4 = L'@';
    }
    else if (((char)*plVar1 == 'M') && (*(char *)((long)plVar1 + 1) == 'Z')) {
      local_30 = 0;
      local_38 = 0x1000;
      do {
        while( true ) {
          if (0x1ffff < local_30) goto LAB_002507d3;
          in_stack_ffffffffffffffc0 =
               (archive_read *)
               __archive_read_ahead
                         (in_stack_ffffffffffffffc0,
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          (ssize_t *)0x25072f);
          if (in_stack_ffffffffffffffc0 == (archive_read *)0x0) break;
          for (local_20 = (char *)((long)&(in_stack_ffffffffffffffc0->archive).magic + local_30);
              local_20 + 8 < (char *)((long)&(in_stack_ffffffffffffffc0->archive).magic + local_28);
              local_20 = local_20 + in_stack_ffffffffffffffbc) {
            in_stack_ffffffffffffffbc = find_cab_magic(local_20);
            if (in_stack_ffffffffffffffbc == L'\0') {
              return L'@';
            }
          }
          local_30 = (long)local_20 - (long)in_stack_ffffffffffffffc0;
        }
        local_38 = (long)local_38 >> 1;
      } while (0x7f < local_38);
      local_4 = L'\0';
    }
    else {
LAB_002507d3:
      local_4 = L'\0';
    }
  }
  else {
    local_4 = L'\xffffffff';
  }
  return local_4;
}

Assistant:

static int
archive_read_format_cab_bid(struct archive_read *a, int best_bid)
{
	const char *p;
	ssize_t bytes_avail, offset, window;

	/* If there's already a better bid than we can ever
	   make, don't bother testing. */
	if (best_bid > 64)
		return (-1);

	if ((p = __archive_read_ahead(a, 8, NULL)) == NULL)
		return (-1);

	if (memcmp(p, "MSCF\0\0\0\0", 8) == 0)
		return (64);

	/*
	 * Attempt to handle self-extracting archives
	 * by noting a PE header and searching forward
	 * up to 128k for a 'MSCF' marker.
	 */
	if (p[0] == 'M' && p[1] == 'Z') {
		offset = 0;
		window = 4096;
		while (offset < (1024 * 128)) {
			const char *h = __archive_read_ahead(a, offset + window,
			    &bytes_avail);
			if (h == NULL) {
				/* Remaining bytes are less than window. */
				window >>= 1;
				if (window < 128)
					return (0);
				continue;
			}
			p = h + offset;
			while (p + 8 < h + bytes_avail) {
				int next;
				if ((next = find_cab_magic(p)) == 0)
					return (64);
				p += next;
			}
			offset = p - h;
		}
	}
	return (0);
}